

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

float nk_do_scrollbarv(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  undefined1 auVar1 [16];
  nk_bool nVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  nk_rect bounds;
  nk_rect nVar9;
  nk_flags ws;
  nk_rect empty_south;
  float local_e4;
  nk_rect local_d0;
  float local_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  nk_rect local_98;
  nk_rect local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  nk_rect local_50;
  nk_rect local_40;
  
  fVar3 = 0.0;
  if (style != (nk_style_scrollbar *)0x0 && out != (nk_command_buffer *)0x0) {
    local_d0._8_8_ = scroll._8_8_;
    auVar8._0_12_ = ZEXT812(0x3f800000);
    auVar8._12_4_ = 0;
    auVar1._8_8_ = 0;
    auVar1._0_4_ = local_d0.w;
    auVar1._4_4_ = local_d0.h;
    _local_b8 = maxps(auVar8,auVar1);
    fVar4 = local_b8._0_4_;
    fVar5 = local_b8._4_4_;
    local_d0._0_8_ = scroll._0_8_;
    local_d0.w = (float)(int)local_b8;
    local_d0.h = (float)(int)((ulong)local_b8 >> 0x20);
    nVar9 = local_d0;
    if (fVar5 < target) {
      if (style->show_buttons != 0) {
        local_bc = fVar5 - (fVar4 + fVar4);
        fVar3 = step;
        if (button_pixel_inc <= step) {
          fVar3 = button_pixel_inc;
        }
        local_a8 = scroll.y;
        local_88.x = local_d0.x;
        local_88.y = local_d0.y;
        local_88.w = 0.0;
        local_88.h = 0.0;
        bounds.h = fVar4;
        bounds.w = fVar4;
        bounds.x = local_d0.x;
        bounds.y = local_d0.y;
        local_d0 = nVar9;
        fStack_a4 = local_a8;
        fStack_a0 = local_a8;
        fStack_9c = local_a8;
        local_78 = fVar4;
        fStack_74 = fVar4;
        fStack_70 = fVar4;
        fStack_6c = fVar4;
        local_68 = fVar5;
        fStack_64 = fVar5;
        fStack_60 = fVar5;
        fStack_5c = fVar5;
        nVar2 = nk_do_button_symbol((nk_flags *)&local_98,out,bounds,style->dec_symbol,
                                    NK_BUTTON_REPEATER,&style->dec_button,in,font);
        local_e4 = offset;
        if (nVar2 != 0) {
          local_e4 = offset - fVar3;
        }
        fVar4 = 0.0;
        if (0.0 <= local_bc) {
          fVar4 = local_bc;
        }
        nVar9.h = fStack_74;
        nVar9.w = local_78;
        nVar9.y = (local_68 + local_a8) - (float)local_b8._0_4_;
        nVar9.x = local_88.x;
        nVar2 = nk_do_button_symbol((nk_flags *)&local_98,out,nVar9,style->inc_symbol,
                                    NK_BUTTON_REPEATER,&style->inc_button,in,font);
        if (nVar2 != 0) {
          local_e4 = local_e4 + fVar3;
        }
        local_d0.y = local_a8 + local_b8._0_4_;
        local_d0.h = fVar4;
        offset = local_e4;
      }
      nVar9 = local_d0;
      fVar4 = local_d0.h;
      if (local_d0.h <= step) {
        step = local_d0.h;
      }
      if (target - local_d0.h <= offset) {
        offset = target - local_d0.h;
      }
      fVar3 = 0.0;
      if (0.0 <= offset) {
        fVar3 = offset;
      }
      fVar5 = style->border;
      fVar6 = (style->padding).y;
      local_40.x = local_d0.x;
      fVar7 = local_d0.y;
      local_50.y = (fVar3 / target) * local_d0.h + fVar7 + fVar5 + fVar6;
      fVar6 = (local_d0.h / target) * local_d0.h - (fVar6 + fVar6 + fVar5 + fVar5);
      local_50.h = 0.0;
      if (0.0 <= fVar6) {
        local_50.h = fVar6;
      }
      fVar6 = (style->padding).x;
      local_50.x = fVar5 + local_40.x + fVar6;
      local_98.w = local_b8._0_4_;
      local_50.w = local_98.w - (fVar6 + fVar6 + fVar5 + fVar5);
      local_98.x = local_d0.x;
      local_98.y = local_d0.y;
      local_40.y = local_50.h + local_50.y;
      local_b8._4_4_ = fVar7;
      local_b8._0_4_ = fVar7;
      fStack_b0 = fVar7;
      fStack_ac = fVar7;
      local_98.h = 0.0;
      if (0.0 <= local_50.y - fVar7) {
        local_98.h = local_50.y - fVar7;
      }
      fVar5 = (local_d0.h + fVar7) - local_40.y;
      local_40.h = 0.0;
      if (0.0 <= fVar5) {
        local_40.h = fVar5;
      }
      local_d0 = nVar9;
      local_40.w = local_98.w;
      fVar3 = nk_scrollbar_behavior
                        (state,in,has_scrolling,&local_d0,&local_50,&local_98,&local_40,fVar3,target
                         ,step,NK_VERTICAL);
      local_50.y = (fVar3 / target) * fVar4 + (float)local_b8._0_4_ + style->border_cursor +
                   (style->padding).y;
      if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      }
      nk_draw_scrollbar(out,*state,style,&local_d0,&local_50);
      if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
      }
    }
  }
  return fVar3;
}

Assistant:

NK_LIB float
nk_do_scrollbarv(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
float offset, float target, float step, float button_pixel_inc,
const struct nk_style_scrollbar *style, struct nk_input *in,
const struct nk_user_font *font)
{
struct nk_rect empty_north;
struct nk_rect empty_south;
struct nk_rect cursor;

float scroll_step;
float scroll_offset;
float scroll_off;
float scroll_ratio;

NK_ASSERT(out);
NK_ASSERT(style);
NK_ASSERT(state);
if (!out || !style) return 0;

scroll.w = NK_MAX(scroll.w, 1);
scroll.h = NK_MAX(scroll.h, 0);
if (target <= scroll.h) return 0;

/* optional scrollbar buttons */
if (style->show_buttons) {
nk_flags ws;
float scroll_h;
struct nk_rect button;

button.x = scroll.x;
button.w = scroll.w;
button.h = scroll.w;

scroll_h = NK_MAX(scroll.h - 2 * button.h,0);
scroll_step = NK_MIN(step, button_pixel_inc);

/* decrement button */
button.y = scroll.y;
if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
NK_BUTTON_REPEATER, &style->dec_button, in, font))
offset = offset - scroll_step;

/* increment button */
button.y = scroll.y + scroll.h - button.h;
if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
NK_BUTTON_REPEATER, &style->inc_button, in, font))
offset = offset + scroll_step;

scroll.y = scroll.y + button.h;
scroll.h = scroll_h;
}

/* calculate scrollbar constants */
scroll_step = NK_MIN(step, scroll.h);
scroll_offset = NK_CLAMP(0, offset, target - scroll.h);
scroll_ratio = scroll.h / target;
scroll_off = scroll_offset / target;

/* calculate scrollbar cursor bounds */
cursor.h = NK_MAX((scroll_ratio * scroll.h) - (2*style->border + 2*style->padding.y), 0);
cursor.y = scroll.y + (scroll_off * scroll.h) + style->border + style->padding.y;
cursor.w = scroll.w - (2 * style->border + 2 * style->padding.x);
cursor.x = scroll.x + style->border + style->padding.x;

/* calculate empty space around cursor */
empty_north.x = scroll.x;
empty_north.y = scroll.y;
empty_north.w = scroll.w;
empty_north.h = NK_MAX(cursor.y - scroll.y, 0);

empty_south.x = scroll.x;
empty_south.y = cursor.y + cursor.h;
empty_south.w = scroll.w;
empty_south.h = NK_MAX((scroll.y + scroll.h) - (cursor.y + cursor.h), 0);

/* update scrollbar */
scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
&empty_north, &empty_south, scroll_offset, target, scroll_step, NK_VERTICAL);
scroll_off = scroll_offset / target;
cursor.y = scroll.y + (scroll_off * scroll.h) + style->border_cursor + style->padding.y;

/* draw scrollbar */
if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
if (style->draw_end) style->draw_end(out, style->userdata);
return scroll_offset;
}